

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

TermList ApplicativeHelper::getHead(TermList t)

{
  bool bVar1;
  Term *this;
  TermList *pTVar2;
  TermList *in_RDI;
  TermList *local_8;
  
  bVar1 = Kernel::TermList::isTerm((TermList *)0x8413e3);
  local_8 = in_RDI;
  if (bVar1) {
    do {
      bVar1 = Kernel::TermList::isApplication(in_RDI);
      if (!bVar1) {
        return (TermList)(uint64_t)in_RDI;
      }
      this = Kernel::TermList::term((TermList *)0x84140f);
      pTVar2 = Kernel::Term::nthArgument(this,2);
      in_RDI = (TermList *)pTVar2->_content;
      bVar1 = Kernel::TermList::isTerm((TermList *)0x84142e);
      if (!bVar1) {
        return (TermList)(uint64_t)in_RDI;
      }
      Kernel::TermList::term((TermList *)0x84143e);
      bVar1 = Kernel::Term::isSpecial((Term *)0x841446);
      local_8 = in_RDI;
    } while (!bVar1);
  }
  return (TermList)(uint64_t)local_8;
}

Assistant:

TermList ApplicativeHelper::getHead(TermList t)
{
  if(!t.isTerm()){
    return t; 
  }

  while(t.isApplication()){
    t = *t.term()->nthArgument(2);
    if(!t.isTerm() || t.term()->isSpecial()){ break; } 
  }
  return t;
}